

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

IVec4 __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::getUsedAreaBoundingBox
          (RandomizedRenderGrid *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 extraout_RDX;
  long in_RSI;
  IVec4 IVar5;
  Vector<int,_2> local_28;
  IVec2 size;
  IVec2 lastCell;
  RandomizedRenderGrid *this_local;
  
  iVar4 = *(int *)(in_RSI + 0x18);
  iVar1 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(in_RSI + 0x10));
  iVar1 = de::min<int>(iVar4 + 1,iVar1);
  iVar4 = *(int *)(in_RSI + 0x18);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(in_RSI + 0x10));
  iVar3 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(in_RSI + 0x10));
  tcu::Vector<int,_2>::Vector(&size,iVar1,(iVar4 + iVar2 + -1) / iVar3);
  tcu::operator*((tcu *)&local_28,&size,(Vector<int,_2> *)(in_RSI + 8));
  iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(in_RSI + 0x20));
  iVar1 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(in_RSI + 0x20));
  iVar2 = tcu::Vector<int,_2>::x(&local_28);
  iVar3 = tcu::Vector<int,_2>::y(&local_28);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this,iVar4,iVar1,iVar2,iVar3);
  IVar5.m_data[2] = (int)extraout_RDX;
  IVar5.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar5.m_data._0_8_ = this;
  return (IVec4)IVar5.m_data;
}

Assistant:

IVec4 RandomizedRenderGrid::getUsedAreaBoundingBox (void) const
{
	const IVec2 lastCell	(de::min(m_currentCell + 1, m_grid.x()), ((m_currentCell + m_grid.x() - 1) / m_grid.x()));
	const IVec2 size		= lastCell * m_cellSize;

	return IVec4(m_baseRandomOffset.x(), m_baseRandomOffset.y(), size.x(), size.y());
}